

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOServer.cpp
# Opt level: O2

void __thiscall mognetwork::TcpASIOServer::remSocket(TcpASIOServer *this,SocketFD socket)

{
  TcpSocket *this_00;
  SocketFD SVar1;
  iterator __position;
  
  __position._M_node =
       (this->m_socketList).
       super__List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  while (__position._M_node != (_List_node_base *)&this->m_socketList) {
    SVar1 = Socket::getSocketFD((Socket *)__position._M_node[1]._M_next);
    if (SVar1 == socket) {
      this_00 = (TcpSocket *)__position._M_node[1]._M_next;
      TcpSocket::disconnect(this_00);
      __position = std::__cxx11::
                   list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>::erase
                             (&this->m_socketList,__position);
      (*(this_00->super_Socket)._vptr_Socket[1])(this_00);
    }
    else {
      __position._M_node = (__position._M_node)->_M_next;
    }
  }
  return;
}

Assistant:

void TcpASIOServer::remSocket(SocketFD socket)
  {
    for (std::list<TcpSocket*>::iterator it = m_socketList.begin(); it != m_socketList.end();)
      {
	if ((*it)->getSocketFD() == socket)
	  {
	    TcpSocket* value = *it;
	    (*it)->disconnect();
	    it = m_socketList.erase(it);
	    delete value;
	  }
	else
	  ++it;
      }
  }